

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

String * __thiscall kj::_::TraceBuilder::toString(String *__return_storage_ptr__,TraceBuilder *this)

{
  String *params_1;
  size_t in_RCX;
  ArrayPtr<void_*const> AVar1;
  String local_68;
  ArrayPtr<void_*const> local_50;
  undefined1 local_40 [24];
  undefined1 local_28 [8];
  ArrayPtr<void_*> result;
  TraceBuilder *this_local;
  
  result.size_ = (size_t)this;
  _local_28 = finish(this);
  local_50 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)local_28);
  AVar1.size_ = in_RCX;
  AVar1.ptr = (void **)local_50.size_;
  stringifyStackTraceAddresses((String *)local_40,(kj *)local_50.ptr,AVar1);
  AVar1 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)local_28);
  params_1 = (String *)AVar1.ptr;
  stringifyStackTrace(&local_68,AVar1);
  str<kj::String,kj::String>(__return_storage_ptr__,(kj *)local_40,&local_68,params_1);
  String::~String(&local_68);
  String::~String((String *)local_40);
  return __return_storage_ptr__;
}

Assistant:

String TraceBuilder::toString() {
  auto result = finish();
  return kj::str(stringifyStackTraceAddresses(result),
                 stringifyStackTrace(result));
}